

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void ps_table_release(PS_Table table)

{
  FT_Memory memory;
  
  if (table->init == 0xdeadbeef) {
    memory = table->memory;
    ft_mem_free(memory,table->block);
    table->block = (FT_Byte *)0x0;
    ft_mem_free(memory,table->elements);
    table->elements = (FT_Byte **)0x0;
    ft_mem_free(memory,table->lengths);
    table->lengths = (FT_UInt *)0x0;
    table->init = 0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_table_release( PS_Table  table )
  {
    FT_Memory  memory = table->memory;


    if ( (FT_ULong)table->init == 0xDEADBEEFUL )
    {
      FT_FREE( table->block );
      FT_FREE( table->elements );
      FT_FREE( table->lengths );
      table->init = 0;
    }
  }